

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  int iVar1;
  char *in_RDX;
  Parse *in_RSI;
  undefined8 *in_RDI;
  int iDb;
  Index *pIndex;
  int in_stack_00000044;
  Index *in_stack_00000048;
  Parse *in_stack_00000050;
  Vdbe *pIndex_00;
  
  if (*(char *)((long)&in_RSI->nMem + 3) != '\x01') {
    for (pIndex_00 = in_RSI->pVdbe; pIndex_00 != (Vdbe *)0x0;
        pIndex_00 = *(Vdbe **)&pIndex_00->nCursor) {
      if ((in_RDX == (char *)0x0) || (iVar1 = collationMatch(in_RDX,(Index *)pIndex_00), iVar1 != 0)
         ) {
        sqlite3SchemaToIndex((sqlite3 *)*in_RDI,(Schema *)in_RSI->pIdxEpr);
        sqlite3BeginWriteOperation(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
        sqlite3RefillIndex(in_stack_00000050,in_stack_00000048,in_stack_00000044);
      }
    }
  }
  return;
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  if( !IsVirtual(pTab) ){
    Index *pIndex;              /* An index associated with pTab */

    for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
      if( zColl==0 || collationMatch(zColl, pIndex) ){
        int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
        sqlite3BeginWriteOperation(pParse, 0, iDb);
        sqlite3RefillIndex(pParse, pIndex, -1);
      }
    }
  }
}